

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

void __thiscall Compiler::writeNBytes(Compiler *this,void *addr,int count)

{
  undefined1 *puVar1;
  string *psVar2;
  ulong uVar3;
  char bytes [8];
  undefined1 local_48 [8];
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  puVar1 = local_48;
  uVar3 = (ulong)(uint)count;
  if (7 < count - 1U) {
    psVar2 = (string *)__cxa_allocate_exception(0x28);
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"compiler error","");
    *(string **)psVar2 = psVar2 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar2,local_40,local_40 + local_38);
    *(undefined8 *)(psVar2 + 0x20) = 0;
    __cxa_throw(psVar2,&Error::typeinfo,Error::~Error);
  }
  if (0 < count) {
    do {
      *puVar1 = *(undefined1 *)((long)addr + (uVar3 - 1));
      puVar1 = puVar1 + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  std::ostream::write((char *)this->_wtr,(long)local_48);
  return;
}

Assistant:

void Compiler::writeNBytes(void* addr, int count) {
	char bytes[8];
	if (!(0 < count && count <= 8)) {
		throw Error("compiler error");
	}
	char* p = reinterpret_cast<char*>(addr) + (count - 1);
	for (int i = 0; i < count; ++i) {
		bytes[i] = *p--;
	}
	_wtr.write(bytes, count);
}